

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOW
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,int32_t month,int32_t weekInMonth,int32_t dayOfWeek,UDate startTime,
          UDate untilTime,UErrorCode *status)

{
  VTimeZone *pVVar1;
  UnicodeString dstr;
  undefined1 local_70 [64];
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  beginZoneProps(this,writer,isDst,zonename,fromOffset,toOffset,startTime,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  beginRRULE(this,writer,month,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  UnicodeString::doAppend(writer->out,(UChar *)ICAL_BYDAY,0,-1);
  local_70._0_2_ = 0x3d;
  UnicodeString::doAppend(writer->out,(UChar *)local_70,0,1);
  local_70._0_8_ = &PTR__UnicodeString_003e4fd8;
  local_70._8_2_ = 2;
  appendAsciiDigits(weekInMonth,'\0',(UnicodeString *)local_70);
  if (-1 < (short)local_70._8_2_) {
    local_70._12_4_ = (int)(short)local_70._8_2_ >> 5;
  }
  UnicodeString::doAppend(writer->out,(UnicodeString *)local_70,0,local_70._12_4_);
  UnicodeString::doAppend(writer->out,(UChar *)(ICAL_DOW_NAMES + (long)(dayOfWeek + -1) * 6),0,-1);
  if ((untilTime != 1.838821689216e+17) || (NAN(untilTime))) {
    pVVar1 = (VTimeZone *)local_70;
    getDateTimeString((double)fromOffset + untilTime,(UnicodeString *)pVVar1);
    appendUNTIL(pVVar1,writer,(UnicodeString *)local_70,status);
    if (U_ZERO_ERROR < *status) goto LAB_0020ce2d;
  }
  pVVar1 = (VTimeZone *)writer->out;
  UnicodeString::doAppend((UnicodeString *)pVVar1,L"\r\n",0,-1);
  endZoneProps(pVVar1,writer,isDst,status);
LAB_0020ce2d:
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOW(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                               int32_t fromOffset, int32_t toOffset,
                               int32_t month, int32_t weekInMonth, int32_t dayOfWeek,
                               UDate startTime, UDate untilTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    beginZoneProps(writer, isDst, zonename, fromOffset, toOffset, startTime, status);
    if (U_FAILURE(status)) {
        return;
    }
    beginRRULE(writer, month, status);
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BYDAY);
    writer.write(EQUALS_SIGN);
    UnicodeString dstr;
    appendAsciiDigits(weekInMonth, 0, dstr);
    writer.write(dstr);    // -4, -3, -2, -1, 1, 2, 3, 4
    writer.write(ICAL_DOW_NAMES[dayOfWeek - 1]);    // SU, MO, TU...

    if (untilTime != MAX_MILLIS) {
        appendUNTIL(writer, getDateTimeString(untilTime + fromOffset, dstr), status);
        if (U_FAILURE(status)) {
            return;
        }
    }
    writer.write(ICAL_NEWLINE);
    endZoneProps(writer, isDst, status);
}